

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_rom_writer.cpp
# Opt level: O0

void write_maps_fall_destination(World *world,ROM *rom)

{
  bool bVar1;
  map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
  *this;
  LandstalkerException *this_00;
  allocator<char> local_79;
  string local_78;
  uint16_t local_52;
  type *ppMStack_50;
  uint16_t fall_destination;
  type *map;
  type *map_id;
  _Self local_38;
  const_iterator __end1;
  const_iterator __begin1;
  map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
  *__range1;
  uint32_t addr;
  ROM *rom_local;
  World *world_local;
  
  __range1._4_4_ = 0xa1a8;
  this = World::maps(world);
  __end1 = std::
           map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
           ::begin(this);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
       ::end(this);
  while( true ) {
    bVar1 = std::operator==(&__end1,&local_38);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    map_id = &std::_Rb_tree_const_iterator<std::pair<const_unsigned_short,_Map_*>_>::operator*
                        (&__end1)->first;
    map = (type *)std::get<0ul,unsigned_short_const,Map*>
                            ((pair<const_unsigned_short,_Map_*> *)map_id);
    ppMStack_50 = std::get<1ul,unsigned_short_const,Map*>
                            ((pair<const_unsigned_short,_Map_*> *)map_id);
    local_52 = Map::fall_destination(*ppMStack_50);
    if (local_52 != 0xffff) {
      md::ROM::set_word(rom,__range1._4_4_,*(uint16_t *)map);
      md::ROM::set_word(rom,__range1._4_4_ + 2,local_52);
      __range1._4_4_ = __range1._4_4_ + 4;
    }
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_short,_Map_*>_>::operator++(&__end1);
  }
  md::ROM::set_word(rom,__range1._4_4_,0xffff);
  if (0xa35a < __range1._4_4_ + 2) {
    this_00 = (LandstalkerException *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,
               "Fall destination table must not be bigger than the one from base game",&local_79);
    LandstalkerException::LandstalkerException(this_00,&local_78);
    __cxa_throw(this_00,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException)
    ;
  }
  return;
}

Assistant:

static void write_maps_fall_destination(const World& world, md::ROM& rom)
{
    uint32_t addr = offsets::MAP_FALL_DESTINATION_TABLE;

    for(auto& [map_id, map] : world.maps())
    {
        uint16_t fall_destination = map->fall_destination();
        if(fall_destination != 0xFFFF)
        {
            rom.set_word(addr, map_id);
            rom.set_word(addr+2, fall_destination);
            addr += 0x4;
        }
    }

    rom.set_word(addr, 0xFFFF);
    addr += 0x2;
    if(addr > offsets::MAP_FALL_DESTINATION_TABLE_END)
        throw LandstalkerException("Fall destination table must not be bigger than the one from base game");
}